

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX.cpp
# Opt level: O0

void amrex::Finalize(AMReX *pamrex)

{
  bool bVar1;
  int iVar2;
  reference pp_Var3;
  Print *this;
  ostream *poVar4;
  bool is_ioproc;
  int global_min;
  int global_max;
  int mp_tot;
  int mp_max;
  int mp_min;
  char (*in_stack_fffffffffffffc18) [21];
  Print *in_stack_fffffffffffffc20;
  ostream *in_stack_fffffffffffffc48;
  Print *in_stack_fffffffffffffc50;
  int *in_stack_fffffffffffffc58;
  int *in_stack_fffffffffffffc60;
  Print *in_stack_fffffffffffffc90;
  string local_368 [39];
  byte local_341;
  int local_1b4;
  int local_1b0 [103];
  int local_14;
  
  AMReX::erase((AMReX *)in_stack_fffffffffffffc50);
  while (bVar1 = std::stack<void_(*)(),_std::deque<void_(*)(),_std::allocator<void_(*)()>_>_>::empty
                           ((stack<void_(*)(),_std::deque<void_(*)(),_std::allocator<void_(*)()>_>_>
                             *)0xf01358), ((bVar1 ^ 0xffU) & 1) != 0) {
    pp_Var3 = std::stack<void_(*)(),_std::deque<void_(*)(),_std::allocator<void_(*)()>_>_>::top
                        ((stack<void_(*)(),_std::deque<void_(*)(),_std::allocator<void_(*)()>_>_> *)
                         0xf0136c);
    (**pp_Var3)();
    std::stack<void_(*)(),_std::deque<void_(*)(),_std::allocator<void_(*)()>_>_>::pop
              ((stack<void_(*)(),_std::deque<void_(*)(),_std::allocator<void_(*)()>_>_> *)0xf0137a);
  }
  if (1 < system::verbose) {
    amrex_mempool_get_stats
              (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,&in_stack_fffffffffffffc50->rank)
    ;
    iVar2 = ParallelDescriptor::NProcs();
    if (iVar2 == 1) {
      if (0 < local_14) {
        OutStream();
        Print::Print(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        this = Print::operator<<(in_stack_fffffffffffffc20,(char (*) [10])in_stack_fffffffffffffc18)
        ;
        Print::operator<<(in_stack_fffffffffffffc20,(char (*) [11])in_stack_fffffffffffffc18);
        Print::operator<<(in_stack_fffffffffffffc20,(int *)in_stack_fffffffffffffc18);
        Print::operator<<(in_stack_fffffffffffffc20,(char (*) [5])in_stack_fffffffffffffc18);
        Print::operator<<(in_stack_fffffffffffffc20,
                          (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                           *)in_stack_fffffffffffffc18);
        Print::~Print(this);
      }
    }
    else {
      local_1b0[0] = local_14;
      local_1b4 = local_14;
      ParallelDescriptor::ReduceIntMax(local_1b0);
      if (0 < local_1b0[0]) {
        ParallelDescriptor::ReduceIntMin(&local_1b4);
        OutStream();
        Print::Print(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
        Print::operator<<(in_stack_fffffffffffffc20,(char (*) [10])in_stack_fffffffffffffc18);
        Print::operator<<(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        Print::operator<<(in_stack_fffffffffffffc20,(int *)in_stack_fffffffffffffc18);
        Print::operator<<(in_stack_fffffffffffffc20,(char (*) [6])in_stack_fffffffffffffc18);
        Print::operator<<(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        Print::operator<<(in_stack_fffffffffffffc20,(int *)in_stack_fffffffffffffc18);
        Print::operator<<(in_stack_fffffffffffffc20,(char (*) [6])in_stack_fffffffffffffc18);
        Print::~Print(in_stack_fffffffffffffc90);
      }
    }
  }
  amrex_mempool_finalize();
  Arena::Finalize();
  if (system::signal_handling != 0) {
    if (::(anonymous_namespace)::prev_handler_sigsegv != (__sighandler_t)0xffffffffffffffff) {
      signal(0xb,::(anonymous_namespace)::prev_handler_sigsegv);
    }
    if (::(anonymous_namespace)::prev_handler_sigterm != (__sighandler_t)0xffffffffffffffff) {
      signal(0xf,::(anonymous_namespace)::prev_handler_sigterm);
    }
    if (::(anonymous_namespace)::prev_handler_sigint != (__sighandler_t)0xffffffffffffffff) {
      signal(2,::(anonymous_namespace)::prev_handler_sigint);
    }
    if (::(anonymous_namespace)::prev_handler_sigabrt != (__sighandler_t)0xffffffffffffffff) {
      signal(6,::(anonymous_namespace)::prev_handler_sigabrt);
    }
    if (::(anonymous_namespace)::prev_handler_sigfpe != (__sighandler_t)0xffffffffffffffff) {
      signal(8,::(anonymous_namespace)::prev_handler_sigfpe);
    }
    if (::(anonymous_namespace)::curr_fpe_excepts != 0) {
      fedisableexcept(::(anonymous_namespace)::curr_fpe_excepts);
      feenableexcept(::(anonymous_namespace)::prev_fpe_excepts);
    }
  }
  std::set_new_handler(::(anonymous_namespace)::prev_new_handler);
  poVar4 = OutStream();
  std::ios_base::precision
            ((ios_base *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18)),
             ::(anonymous_namespace)::prev_out_precision);
  poVar4 = ErrorStream();
  std::ios_base::precision
            ((ios_base *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18)),
             ::(anonymous_namespace)::prev_err_precision);
  local_341 = ParallelDescriptor::IOProcessor();
  ParallelDescriptor::EndParallel();
  if ((0 < system::verbose) && ((local_341 & 1) != 0)) {
    poVar4 = OutStream();
    poVar4 = std::operator<<(poVar4,"AMReX (");
    Version_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,local_368);
    poVar4 = std::operator<<(poVar4,") finalized");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_368);
  }
  return;
}

Assistant:

void
amrex::Finalize (amrex::AMReX* pamrex)
{
#ifdef AMREX_USE_GPU
    Gpu::streamSynchronizeAll();
#endif

    AMReX::erase(pamrex);

#ifdef AMREX_USE_HYPRE
    if (init_hypre) HYPRE_Finalize();
#endif

    BL_TINY_PROFILE_FINALIZE();
    BL_PROFILE_FINALIZE();

#ifdef AMREX_USE_CUDA
    amrex::DeallocateRandomSeedDevArray();
#endif

#ifdef BL_LAZY
    Lazy::Finalize();
#endif

    while (!The_Finalize_Function_Stack.empty())
    {
        //
        // Call the registered function.
        //
        (*The_Finalize_Function_Stack.top())();
        //
        // And then remove it from the stack.
        //
        The_Finalize_Function_Stack.pop();
    }

    // The MemPool stuff is not using The_Finalize_Function_Stack so that
    // it can be used in Fortran BoxLib.
#ifndef BL_AMRPROF
    if (amrex::system::verbose > 1)
    {
        int mp_min, mp_max, mp_tot;
        amrex_mempool_get_stats(mp_min, mp_max, mp_tot);  // in MB
        if (ParallelDescriptor::NProcs() == 1) {
            if (mp_tot > 0) {
                amrex::Print() << "MemPool: "
#ifdef AMREX_USE_OMP
                               << "min used in a thread: " << mp_min << " MB, "
                               << "max used in a thread: " << mp_max << " MB, "
#endif
                               << "tot used: " << mp_tot << " MB." << std::endl;
            }
        } else {
            int global_max = mp_tot;
            int global_min = mp_tot;
            ParallelDescriptor::ReduceIntMax(global_max);
            if (global_max > 0) {
                ParallelDescriptor::ReduceIntMin(global_min);
                amrex::Print() << "MemPool: "
                               << "min used in a rank: " << global_min << " MB, "
                               << "max used in a rank: " << global_max << " MB.\n";
            }
        }
    }
#endif

#ifdef AMREX_MEM_PROFILING
    MemProfiler::report("Final");
    MemProfiler::Finalize();
#endif

#ifdef AMREX_USE_SUNDIALS
    sundials::Finalize();
#endif

    amrex_mempool_finalize();
    Arena::Finalize();

#ifndef BL_AMRPROF
    if (system::signal_handling)
    {
        if (prev_handler_sigsegv != SIG_ERR) signal(SIGSEGV, prev_handler_sigsegv);
        if (prev_handler_sigterm != SIG_ERR) signal(SIGTERM, prev_handler_sigterm);
        if (prev_handler_sigint != SIG_ERR) signal(SIGINT, prev_handler_sigint);
        if (prev_handler_sigabrt != SIG_ERR) signal(SIGABRT, prev_handler_sigabrt);
        if (prev_handler_sigfpe != SIG_ERR) signal(SIGFPE, prev_handler_sigfpe);
#if defined(__linux__)
#if !defined(__PGI) || (__PGIC__ >= 16)
        if (curr_fpe_excepts != 0) {
            fedisableexcept(curr_fpe_excepts);
            feenableexcept(prev_fpe_excepts);
        }
#endif
#elif defined(__APPLE__) && defined(__x86_64__)
        if (curr_fpe_excepts != 0u) {
            _MM_SET_EXCEPTION_MASK(prev_fpe_mask);
        }
#endif
    }
#endif

#ifdef AMREX_USE_GPU
    Gpu::Device::Finalize();
#endif

#if defined(AMREX_USE_UPCXX)
    upcxx::finalize();
#endif

    std::set_new_handler(prev_new_handler);

    amrex::OutStream().precision(prev_out_precision);
    amrex::ErrorStream().precision(prev_err_precision);

    bool is_ioproc = ParallelDescriptor::IOProcessor();

    /* Don't shut down MPI if GASNet is still using MPI */
#ifndef GASNET_CONDUIT_MPI
    ParallelDescriptor::EndParallel();
#endif

    if (amrex::system::verbose > 0 && is_ioproc) {
        amrex::OutStream() << "AMReX (" << amrex::Version() << ") finalized" << std::endl;
    }
}